

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eimgfs.cpp
# Opt level: O2

void __thiscall
exe_reconstructor::add_sectioninfo
          (exe_reconstructor *this,string *name,uint64_t size,ReadWriter_ptr *r)

{
  sectioninfo *this_00;
  shared_ptr<exe_reconstructor::sectioninfo> local_50;
  __shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  this_00 = (sectioninfo *)operator_new(0x38);
  std::__shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_40,&r->super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>);
  sectioninfo::sectioninfo(this_00,name,size,(ReadWriter_ptr *)&local_40);
  std::__shared_ptr<exe_reconstructor::sectioninfo,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<exe_reconstructor::sectioninfo,void>
            ((__shared_ptr<exe_reconstructor::sectioninfo,(__gnu_cxx::_Lock_policy)2> *)&local_50,
             this_00);
  std::
  vector<std::shared_ptr<exe_reconstructor::sectioninfo>,std::allocator<std::shared_ptr<exe_reconstructor::sectioninfo>>>
  ::emplace_back<std::shared_ptr<exe_reconstructor::sectioninfo>>
            ((vector<std::shared_ptr<exe_reconstructor::sectioninfo>,std::allocator<std::shared_ptr<exe_reconstructor::sectioninfo>>>
              *)&this->_sections,&local_50);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_50.
              super___shared_ptr<exe_reconstructor::sectioninfo,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
  return;
}

Assistant:

void add_sectioninfo(const std::string& name, uint64_t size, ReadWriter_ptr r)
    {
        _sections.push_back(sectioninfo_ptr(new sectioninfo(name, size, r)));
    }